

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O2

void __thiscall
Memory::SmallHeapBlockT<SmallAllocationBlockAttributes>::MarkImplicitRoots
          (SmallHeapBlockT<SmallAllocationBlockAttributes> *this)

{
  ushort uVar1;
  ushort uVar2;
  BVStatic<256UL> *this_00;
  code *pcVar3;
  ushort markCount;
  bool bVar4;
  byte *pbVar5;
  uint uVar6;
  uint i;
  uint index;
  BVIndex BVar7;
  undefined4 *local_40;
  BVIndex local_34;
  
  uVar1 = this->objectCount;
  uVar2 = this->objectSize;
  this_00 = this->markBits;
  if (uVar2 < 0x2001) {
    local_40 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    local_40 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *local_40 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x78e,"(localObjectSize <= HeapConstants::MaxMediumObjectSize)",
                       "localObjectSize <= HeapConstants::MaxMediumObjectSize");
    if (!bVar4) goto LAB_0061f36b;
    *local_40 = 0;
  }
  BVar7 = 0;
  uVar6 = 0;
  markCount = 0;
  local_34 = 0;
  for (index = 0; uVar1 != index; index = index + 1) {
    pbVar5 = ObjectInfo(this,index);
    if ((*pbVar5 & 8) != 0) {
      if (0xfff < uVar6) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *local_40 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                           ,0x7a0,"(index < TBlockAttributes::PageCount)",
                           "index < TBlockAttributes::PageCount");
        if (!bVar4) goto LAB_0061f36b;
        *local_40 = 0;
      }
      markCount = markCount + 1;
      BVStatic<256UL>::Set(this_00,BVar7);
      local_34 = local_34 + 1;
    }
    uVar6 = uVar6 + uVar2;
    BVar7 = BVar7 + (uVar2 >> 4);
  }
  BVar7 = BVStatic<256UL>::Count(this_00);
  if (BVar7 != local_34) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *local_40 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x7a9,"(mark->Count() == localMarkCount)","mark->Count() == localMarkCount")
    ;
    if (!bVar4) {
LAB_0061f36b:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *local_40 = 0;
  }
  this->markCount = (ushort)local_34;
  HeapBlockMap64::SetPageMarkCount
            (&this->heapBucket->heapInfo->recycler->heapBlockMap,(this->super_HeapBlock).address,
             markCount);
  return;
}

Assistant:

void
SmallHeapBlockT<TBlockAttributes>::MarkImplicitRoots()
{
    uint localObjectCount = this->GetObjectCount();
    uint localObjectBitDelta = this->GetObjectBitDelta();
    uint localMarkCount = 0;
    SmallHeapBlockBitVector * mark = this->GetMarkedBitVector();

#if DBG
    uint localObjectSize = this->GetObjectSize();
    Assert(localObjectSize <= HeapConstants::MaxMediumObjectSize);

    ushort markCountPerPage[TBlockAttributes::PageCount];
    for (uint i = 0; i < TBlockAttributes::PageCount; i++)
    {
        markCountPerPage[i] = 0;
    }
#endif

    for (uint i = 0; i < localObjectCount; i++)
    {
        // REVIEW: This may include free object.  It is okay to mark them and scan them
        // But kind inefficient.
        if (this->ObjectInfo(i) & ImplicitRootBit)
        {
#if DBG
            {
                int index = (i * localObjectSize) / AutoSystemInfo::PageSize;
                Assert(index < TBlockAttributes::PageCount);
                markCountPerPage[index]++;
            }
#endif

            mark->Set(localObjectBitDelta * i);
            localMarkCount++;
        }
    }
    Assert(mark->Count() == localMarkCount);
    this->markCount = (ushort)localMarkCount;
#if DBG
    HeapBlockMap& map = this->GetRecycler()->heapBlockMap;

    for (uint i = 0; i < TBlockAttributes::PageCount; i++)
    {
        map.SetPageMarkCount(this->address + (i * AutoSystemInfo::PageSize), markCountPerPage[i]);
    }
#endif
}